

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

void __thiscall QCborContainerPrivate::~QCborContainerPrivate(QCborContainerPrivate *this)

{
  QList<QtCbor::Element> *this_00;
  Data *pDVar1;
  Data *pDVar2;
  iterator iVar3;
  iterator iVar4;
  Element *e;
  
  this_00 = &this->elements;
  iVar3 = QList<QtCbor::Element>::begin(this_00);
  iVar4 = QList<QtCbor::Element>::end(this_00);
  for (; iVar3.i != iVar4.i; iVar3.i = iVar3.i + 1) {
    if ((((iVar3.i)->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) != 0) {
      deref(((iVar3.i)->field_0).container);
    }
  }
  pDVar1 = (this_00->d).d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->d).d)->super_QArrayData,0x10,0x10);
    }
  }
  pDVar2 = (this->data).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->data).d.d)->super_QArrayData,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

QCborContainerPrivate::~QCborContainerPrivate()
{
    // delete our elements
    for (Element &e : elements) {
        if (e.flags & Element::IsContainer)
            e.container->deref();
    }
}